

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::LazyDescriptor::SetLazy
          (LazyDescriptor *this,string *name,FileDescriptor *file)

{
  LogMessage *pLVar1;
  string *psVar2;
  GoogleOnceDynamic *pGVar3;
  LogFinisher local_181;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (this->descriptor_ != (Descriptor *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa4);
    pLVar1 = LogMessage::operator<<(&local_68,"CHECK failed: !descriptor_: ");
    LogFinisher::operator=((LogFinisher *)&local_a0,pLVar1);
    LogMessage::~LogMessage(&local_68);
  }
  if (this->file_ != (FileDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa5);
    pLVar1 = LogMessage::operator<<(&local_a0,"CHECK failed: !file_: ");
    LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    LogMessage::~LogMessage(&local_a0);
  }
  if (this->name_ != (string *)0x0) {
    LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa6);
    pLVar1 = LogMessage::operator<<(&local_d8,"CHECK failed: !name_: ");
    LogFinisher::operator=((LogFinisher *)&local_110,pLVar1);
    LogMessage::~LogMessage(&local_d8);
  }
  if (this->once_ != (GoogleOnceDynamic *)0x0) {
    LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa7);
    pLVar1 = LogMessage::operator<<(&local_110,"CHECK failed: !once_: ");
    LogFinisher::operator=((LogFinisher *)&local_180,pLVar1);
    LogMessage::~LogMessage(&local_110);
  }
  if ((file == (FileDescriptor *)0x0) || (*(long *)(file + 0x10) == 0)) {
    LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa8);
    pLVar1 = LogMessage::operator<<(&local_180,"CHECK failed: file && file->pool_: ");
    LogFinisher::operator=((LogFinisher *)&local_148,pLVar1);
    LogMessage::~LogMessage(&local_180);
  }
  if (*(char *)(*(long *)(file + 0x10) + 0x29) == '\0') {
    LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa9);
    pLVar1 = LogMessage::operator<<
                       (&local_180,"CHECK failed: file->pool_->lazily_build_dependencies_: ");
    LogFinisher::operator=((LogFinisher *)&local_148,pLVar1);
    LogMessage::~LogMessage(&local_180);
  }
  if (file[0xb8] == (FileDescriptor)0x1) {
    LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aaa);
    pLVar1 = LogMessage::operator<<(&local_148,"CHECK failed: !file->finished_building_: ");
    LogFinisher::operator=(&local_181,pLVar1);
    LogMessage::~LogMessage(&local_148);
  }
  this->file_ = file;
  if (*(Tables **)(*(long *)(file + 0x10) + 0x20) != (Tables *)0x0) {
    psVar2 = DescriptorPool::Tables::AllocateString
                       (*(Tables **)(*(long *)(file + 0x10) + 0x20),name);
    this->name_ = psVar2;
    if (*(Tables **)(*(long *)(file + 0x10) + 0x20) != (Tables *)0x0) {
      pGVar3 = DescriptorPool::Tables::AllocateOnceDynamic
                         (*(Tables **)(*(long *)(file + 0x10) + 0x20));
      this->once_ = pGVar3;
      return;
    }
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

void LazyDescriptor::SetLazy(const string& name, const FileDescriptor* file) {
  // verify Init() has been called and Set hasn't been called yet.
  GOOGLE_CHECK(!descriptor_);
  GOOGLE_CHECK(!file_);
  GOOGLE_CHECK(!name_);
  GOOGLE_CHECK(!once_);
  GOOGLE_CHECK(file && file->pool_);
  GOOGLE_CHECK(file->pool_->lazily_build_dependencies_);
  GOOGLE_CHECK(!file->finished_building_);
  file_ = file;
  name_ = file->pool_->tables_->AllocateString(name);
  once_ = file->pool_->tables_->AllocateOnceDynamic();
}